

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::DebugAnnotation_NestedValue::Serialize
          (DebugAnnotation_NestedValue *this,Message *msg)

{
  pointer pbVar1;
  pointer pDVar2;
  uint8_t *src_begin;
  Message *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer pbVar4;
  pointer pDVar5;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::DebugAnnotation_NestedValue_NestedType>
              (msg,1,this->nested_type_);
  }
  pbVar1 = (this->dict_keys_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->dict_keys_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    protozero::Message::AppendBytes(msg,2,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  pDVar2 = (this->dict_values_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar5 = (this->dict_values_).
                super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar2; pDVar5 = pDVar5 + 1) {
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,3);
    Serialize(pDVar5,pMVar3);
  }
  pDVar2 = (this->array_values_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar5 = (this->array_values_).
                super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar2; pDVar5 = pDVar5 + 1) {
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,4);
    Serialize(pDVar5,pMVar3);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
    protozero::Message::AppendVarInt<long>(msg,5,this->int_value_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
    protozero::Message::AppendFixed<double>(msg,6,this->double_value_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x80) != 0) {
    protozero::Message::AppendTinyVarInt(msg,7,(uint)this->bool_value_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x100) != 0) {
    protozero::Message::AppendBytes
              (msg,8,(this->string_value_)._M_dataplus._M_p,(this->string_value_)._M_string_length);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void DebugAnnotation_NestedValue::Serialize(::protozero::Message* msg) const {
  // Field 1: nested_type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, nested_type_);
  }

  // Field 2: dict_keys
  for (auto& it : dict_keys_) {
    msg->AppendString(2, it);
  }

  // Field 3: dict_values
  for (auto& it : dict_values_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(3));
  }

  // Field 4: array_values
  for (auto& it : array_values_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(4));
  }

  // Field 5: int_value
  if (_has_field_[5]) {
    msg->AppendVarInt(5, int_value_);
  }

  // Field 6: double_value
  if (_has_field_[6]) {
    msg->AppendFixed(6, double_value_);
  }

  // Field 7: bool_value
  if (_has_field_[7]) {
    msg->AppendTinyVarInt(7, bool_value_);
  }

  // Field 8: string_value
  if (_has_field_[8]) {
    msg->AppendString(8, string_value_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}